

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O3

bool __thiscall ConditionMarker::verifyCondition(ConditionMarker *this,PcodeOp *op,PcodeOp *initop)

{
  bool bVar1;
  int4 iVar2;
  Varnode *vn;
  long lVar3;
  
  setupInitOp(this,initop);
  vn = findMatch(this,op);
  if ((vn == (Varnode *)0x0) || (bVar1 = finalJudgement(this,vn), !bVar1)) {
    bVar1 = false;
  }
  else {
    iVar2 = -1;
    if (this->multion == true) {
      bVar1 = true;
      if (0 < (long)this->state) {
        lVar3 = 0;
        do {
          if (this->opstate[lVar3]->opcode->opcode == CPUI_MULTIEQUAL) {
            iVar2 = this->slotstate[lVar3];
            goto LAB_002f5495;
          }
          lVar3 = lVar3 + 1;
        } while (this->state != lVar3);
      }
    }
    else {
LAB_002f5495:
      this->multislot = iVar2;
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool ConditionMarker::verifyCondition(PcodeOp *op,PcodeOp *initop)

{
  setupInitOp(initop);
  Varnode *matchvn = findMatch(op);
  if (matchvn == (Varnode *)0) return false;
  if (!finalJudgement(matchvn)) return false;

  // Make final determination of what MULTIEQUAL slot is used
  if (!multion)
    multislot = -1;
  else {
    for(int4 i=0;i<state;++i)
      if (opstate[i]->code()==CPUI_MULTIEQUAL) {
	multislot = slotstate[i];
	break;
      }
  }
  return true;
}